

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O1

void IT8951MemBurstReadProc(uint32_t ulMemAddr,uint32_t ulReadSize,uint16_t *pDestBuf)

{
  IT8951MemBurstReadTrigger(ulMemAddr,ulReadSize);
  LCDWriteCmdCode(0x13);
  LCDReadNData(pDestBuf,ulReadSize);
  LCDWriteCmdCode(0x15);
  return;
}

Assistant:

void IT8951MemBurstReadProc(uint32_t ulMemAddr , uint32_t ulReadSize, uint16_t* pDestBuf )
{
    //Send Burst Read Start Cmd and Args
    IT8951MemBurstReadTrigger(ulMemAddr , ulReadSize);
          
    //Burst Read Fire
    IT8951MemBurstReadStart();
    
    //Burst Read Request for SPI interface only
    LCDReadNData(pDestBuf, ulReadSize);

    //Send Burst End Cmd
    IT8951MemBurstEnd(); //the same with IT8951MemBurstEnd()
}